

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::FunctionResolver::throwErrorForUnknownFunction
          (FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name)

{
  Context *this_00;
  IdentifierPath *this_01;
  Scope *this_02;
  ResolutionPass *pRVar1;
  bool bVar2;
  Identifier i;
  string *name_00;
  size_t __val;
  pool_ref<soul::AST::ASTObject> *ppVar3;
  EndpointDeclaration *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long lVar5;
  long lVar6;
  long lVar7;
  pool_ref<soul::AST::ASTObject> local_2a0;
  pool_ptr<soul::AST::EndpointDeclaration> e;
  size_t local_290;
  string possibleFunction;
  Identifier local_220;
  pool_ref<soul::AST::ASTObject> local_218;
  pool_ref<soul::AST::ASTObject> local_210;
  CompileMessage local_208;
  NameSearch local_1d0;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_1d0.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_1d0.itemsFound.space;
  local_1d0.itemsFound.numActive = 0;
  local_1d0.itemsFound.numAllocated = 8;
  local_1d0.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_1d0.partiallyQualifiedPath.pathSections.space;
  local_1d0.partiallyQualifiedPath.pathSections.numActive = 0;
  local_1d0.partiallyQualifiedPath.pathSections.numAllocated = 8;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1d0.stopAtFirstScopeWithResults = false;
  local_1d0.requiredNumFunctionArgs = -1;
  local_1d0.findVariables = true;
  local_1d0.findTypes = true;
  local_1d0.findFunctions = true;
  local_1d0.findNamespaces = true;
  local_1d0.findProcessors = true;
  local_1d0.findProcessorInstances = false;
  local_1d0.findEndpoints = true;
  local_1d0.onlyFindLocalVariables = false;
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
  this_01 = &local_1d0.partiallyQualifiedPath;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&this_01->pathSections,(ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
  local_1d0.stopAtFirstScopeWithResults = true;
  local_1d0.findProcessors = true;
  local_1d0._184_4_ = 0x1010101;
  local_1d0.findProcessorInstances = false;
  local_1d0.findEndpoints = true;
  this_02 = (name->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_02 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_02,&local_1d0,(Statement *)0x0);
  }
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
  if (local_290 == 1) {
    pRVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).owner;
    i = IdentifierPath::getLastPart(this_01);
    IdentifierPath::withSuffix((IdentifierPath *)&e,&pRVar1->intrinsicsNamespacePath,i);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
              (&this_01->pathSections,(ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear
              ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
    AST::Scope::performFullNameSearch
              ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context
               .parentScope,&local_1d0,(Statement *)0x0);
  }
  ppVar3 = local_1d0.itemsFound.items;
  lVar5 = local_1d0.itemsFound.numActive << 3;
  lVar7 = 0;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 8) {
    local_2a0.object = *(ASTObject **)((long)ppVar3 + lVar6);
    bVar2 = is_type<soul::AST::Function,soul::AST::ASTObject>(&local_2a0);
    lVar7 = lVar7 + (ulong)bVar2;
  }
  if (lVar7 != 0) {
    AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
    __val = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
    std::__cxx11::to_string(&possibleFunction,__val);
    Errors::noFunctionWithNumberOfArgs<soul::IdentifierPath,std::__cxx11::string>
              (&local_68,(Errors *)&e,(IdentifierPath *)&possibleFunction,args_1);
    AST::Context::throwError
              (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
  }
  if (local_1d0.itemsFound.numActive != 0) {
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       (&local_1d0.itemsFound);
    local_210.object = ppVar3->object;
    bVar2 = is_type<soul::AST::Processor,soul::AST::ASTObject>(&local_210);
    if (bVar2) {
      Errors::cannotUseProcessorAsFunction<>();
      AST::Context::throwError
                (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false);
    }
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       (&local_1d0.itemsFound);
    local_218.object = ppVar3->object;
    cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&e,&local_218);
    if (e.object != (EndpointDeclaration *)0x0) {
      pEVar4 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&e);
      if (pEVar4->isInput == true) {
        Errors::cannotUseInputAsFunction<>();
      }
      else {
        Errors::cannotUseOutputAsFunction<>();
      }
      AST::Context::throwError
                (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_208,false)
      ;
    }
  }
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
  local_220 = IdentifierPath::getLastPart((IdentifierPath *)&e);
  name_00 = Identifier::operator_cast_to_string_(&local_220);
  findPossibleMisspeltFunction(&possibleFunction,this,name_00);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&e);
  this_00 = &(name->super_Expression).super_Statement.super_ASTObject.context;
  if (possibleFunction._M_string_length == 0) {
    AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
    Errors::unknownFunction<soul::IdentifierPath>(&local_110,(IdentifierPath *)&e);
    AST::Context::throwError(this_00,&local_110,false);
  }
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&e,name);
  Errors::unknownFunctionWithSuggestion<soul::IdentifierPath,std::__cxx11::string&>
            (&local_d8,(Errors *)&e,(IdentifierPath *)&possibleFunction,args_1);
  AST::Context::throwError(this_00,&local_d8,false);
}

Assistant:

void throwErrorForUnknownFunction (AST::CallOrCast& call, AST::QualifiedIdentifier& name)
        {
            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = true;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = false;
            search.findEndpoints = true;

            if (auto scope = name.getParentScope())
                scope->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);
            }

            size_t numFunctions = 0;

            for (auto& i : search.itemsFound)
                if (is_type<AST::Function> (i))
                    ++numFunctions;

            if (numFunctions > 0)
                name.context.throwError (Errors::noFunctionWithNumberOfArgs (name.getPath(),
                                                                             std::to_string (call.getNumArguments())));

            if (! search.itemsFound.empty())
            {
                if (is_type<AST::Processor> (search.itemsFound.front()))
                    name.context.throwError (Errors::cannotUseProcessorAsFunction());

                if (auto e = cast<AST::EndpointDeclaration> (search.itemsFound.front()))
                    name.context.throwError (e->isInput ? Errors::cannotUseInputAsFunction()
                                                        : Errors::cannotUseOutputAsFunction());
            }

            auto possibleFunction = findPossibleMisspeltFunction (name.getPath().getLastPart());

            if (! possibleFunction.empty())
                name.context.throwError (Errors::unknownFunctionWithSuggestion (name.getPath(), possibleFunction));

            name.context.throwError (Errors::unknownFunction (name.getPath()));
        }